

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

ssize_t __thiscall
booster::locale::basic_message<char>::write
          (basic_message<char> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  message_format<char> *pmVar2;
  long lVar3;
  ssize_t sVar4;
  char *pcVar5;
  char_type *pcVar6;
  char *pcVar7;
  undefined4 in_register_00000034;
  char *msg;
  
  pcVar5 = this->c_id_;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (this->id_)._M_dataplus._M_p;
  }
  pcVar6 = (char_type *)(this->context_)._M_string_length;
  if (pcVar6 != (char_type *)0x0) {
    pcVar6 = (this->context_)._M_dataplus._M_p;
  }
  if (this->c_context_ != (char_type *)0x0) {
    pcVar6 = this->c_context_;
  }
  pcVar7 = (char *)(this->plural_)._M_string_length;
  if (pcVar7 != (char *)0x0) {
    pcVar7 = (this->plural_)._M_dataplus._M_p;
  }
  if (this->c_plural_ != (char *)0x0) {
    pcVar7 = this->c_plural_;
  }
  if (*pcVar5 == '\0') {
    return (ssize_t)"";
  }
  bVar1 = std::has_facet<booster::locale::message_format<char>>
                    ((locale *)CONCAT44(in_register_00000034,__fd));
  if (bVar1) {
    pmVar2 = std::use_facet<booster::locale::message_format<char>>
                       ((locale *)CONCAT44(in_register_00000034,__fd));
    if (pcVar7 == (char *)0x0) {
      lVar3 = (**(code **)(*(long *)pmVar2 + 0x10))(pmVar2,(ulong)__buf & 0xffffffff,pcVar6,pcVar5);
    }
    else {
      lVar3 = (**(code **)(*(long *)pmVar2 + 0x18))
                        (pmVar2,(ulong)__buf & 0xffffffff,pcVar6,pcVar5,this->n_);
    }
    if (lVar3 != 0) {
      return lVar3;
    }
  }
  else {
    pmVar2 = (message_format<char> *)0x0;
  }
  msg = pcVar7;
  if (this->n_ == 1) {
    msg = pcVar5;
  }
  if (pcVar7 == (char *)0x0) {
    msg = pcVar5;
  }
  if (!bVar1) {
    pcVar5 = details::string_cast_traits<char>::cast(msg,(string *)__n);
    return (ssize_t)pcVar5;
  }
  sVar4 = (**(code **)(*(long *)pmVar2 + 0x28))(pmVar2,msg,__n);
  return sVar4;
}

Assistant:

char_type const *write(std::locale const &loc,int domain_id,string_type &buffer) const
            {
                char_type const *translated = 0;
                static const char_type empty_string[1] = {0};

                char_type const *id = this->id();
                char_type const *context = this->context();
                char_type const *plural = this->plural();
                
                if(*id == 0)
                    return empty_string;
                
                facet_type const *facet = 0;
                if(std::has_facet<facet_type>(loc))
                    facet = &std::use_facet<facet_type>(loc);

                if(facet) { 
                    if(!plural) {
                        translated = facet->get(domain_id,context,id);
                    }
                    else {
                        translated = facet->get(domain_id,context,id,n_);
                    }
                }

                if(!translated) {
                    char_type const *msg = plural ? ( n_ == 1 ? id : plural) : id;

                    if(facet) {
                        translated = facet->convert(msg,buffer);
                    }
                    else {
                        translated = details::string_cast_traits<char_type>::cast(msg,buffer);
                    }
                }
                return translated;
            }